

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O2

void Fxu_ListDoubleAddPairLast(Fxu_Double *pDiv,Fxu_Pair *pLink)

{
  int *piVar1;
  Fxu_Pair *pFVar2;
  
  if ((pDiv->lPairs).pHead == (Fxu_Pair *)0x0) {
    (pDiv->lPairs).pHead = pLink;
    (pDiv->lPairs).pTail = pLink;
    pLink->pDNext = (Fxu_Pair *)0x0;
    pFVar2 = (Fxu_Pair *)0x0;
  }
  else {
    pLink->pDNext = (Fxu_Pair *)0x0;
    pFVar2 = (pDiv->lPairs).pTail;
    pFVar2->pDNext = pLink;
    (pDiv->lPairs).pTail = pLink;
  }
  pLink->pDPrev = pFVar2;
  piVar1 = &(pDiv->lPairs).nItems;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void Fxu_ListDoubleAddPairLast( Fxu_Double * pDiv, Fxu_Pair * pLink )
{
    Fxu_ListPair * pList = &pDiv->lPairs;
    if ( pList->pHead == NULL )
    {
        pList->pHead = pLink;
        pList->pTail = pLink;
        pLink->pDPrev = NULL;
        pLink->pDNext = NULL;
    }
    else
    {
        pLink->pDNext = NULL;
        pList->pTail->pDNext = pLink;
        pLink->pDPrev = pList->pTail;
        pList->pTail = pLink;
    }
    pList->nItems++;
}